

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

float __thiscall
tcu::TextureCubeView::sampleCompare
          (TextureCubeView *this,Sampler *sampler,float ref,float s,float t,float r,float lod)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  float fVar1;
  CubeFace face;
  ulong uVar2;
  float s_00;
  float lod_00;
  CubeFaceFloatCoords CVar3;
  Vector<int,_3> local_6c;
  CubeFaceFloatCoords local_60;
  Vector<float,_3> local_4c;
  undefined8 local_40;
  CubeFaceFloatCoords coords;
  float lod_local;
  float r_local;
  float t_local;
  float s_local;
  float ref_local;
  Sampler *sampler_local;
  TextureCubeView *this_local;
  
  coords.s = lod;
  coords.t = r;
  Vector<float,_3>::Vector(&local_4c,s,t,r);
  CVar3 = getCubeFaceCoords(&local_4c);
  lod_00 = coords.s;
  local_60._0_8_ = CVar3._0_8_;
  local_40._0_4_ = local_60.face;
  local_40._4_4_ = local_60.s;
  uVar2 = local_40;
  local_60.t = CVar3.t;
  fVar1 = local_60.t;
  coords.face = (CubeFace)local_60.t;
  local_40._0_4_ = CVar3.face;
  face = (CubeFace)local_40;
  local_40._4_4_ = CVar3.s;
  s_00 = local_40._4_4_;
  local_60 = CVar3;
  local_40 = uVar2;
  if ((sampler->seamlessCubeMap & 1U) == 0) {
    levels = this->m_levels[local_60._0_8_ & 0xffffffff];
    numLevels = this->m_numLevels;
    Vector<int,_3>::Vector(&local_6c,0,0,0);
    this_local._4_4_ =
         sampleLevelArray2DCompare(levels,numLevels,sampler,ref,s_00,fVar1,lod_00,&local_6c);
  }
  else {
    this_local._4_4_ =
         sampleLevelArrayCubeSeamlessCompare
                   (&this->m_levels,this->m_numLevels,face,sampler,ref,s_00,fVar1,coords.s);
  }
  return this_local._4_4_;
}

Assistant:

float TextureCubeView::sampleCompare (const Sampler& sampler, float ref, float s, float t, float r, float lod) const
{
	DE_ASSERT(sampler.compare != Sampler::COMPAREMODE_NONE);

	// Computes (face, s, t).
	const CubeFaceFloatCoords coords = getCubeFaceCoords(Vec3(s, t, r));
	if (sampler.seamlessCubeMap)
		return sampleLevelArrayCubeSeamlessCompare(m_levels, m_numLevels, coords.face, sampler, ref, coords.s, coords.t, lod);
	else
		return sampleLevelArray2DCompare(m_levels[coords.face], m_numLevels, sampler, ref, coords.s, coords.t, lod, IVec3(0, 0, 0));
}